

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O0

void __thiscall subprocess::detail::Child::execute_child(Child *this)

{
  pointer pcVar1;
  int iVar2;
  char *__file;
  char **__argv;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  OSError *exp;
  Streams *stream;
  int sys_ret;
  anon_class_1_0_00000001 _dup2_;
  string err_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff4c;
  string *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff60;
  allocator<char> *__a;
  allocator<char> local_4a;
  undefined1 local_49;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (in_RDI->_M_dataplus)._M_p;
  if (*(int *)(pcVar1 + 0x38) == 0) {
    iVar2 = dup(*(int *)(pcVar1 + 0x38));
    *(int *)(pcVar1 + 0x38) = iVar2;
  }
  if ((*(int *)(pcVar1 + 0x40) == 0) || (*(int *)(pcVar1 + 0x40) == 1)) {
    iVar2 = dup(*(int *)(pcVar1 + 0x40));
    *(int *)(pcVar1 + 0x40) = iVar2;
  }
  local_49 = 0;
  execute_child::anon_class_1_0_00000001::operator()
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  execute_child::anon_class_1_0_00000001::operator()
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  execute_child::anon_class_1_0_00000001::operator()
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  if ((*(int *)(pcVar1 + 0x34) != -1) && (2 < *(int *)(pcVar1 + 0x34))) {
    close(*(int *)(pcVar1 + 0x34));
  }
  if ((*(int *)(pcVar1 + 0x38) != -1) && (2 < *(int *)(pcVar1 + 0x38))) {
    close(*(int *)(pcVar1 + 0x38));
  }
  if ((*(int *)(pcVar1 + 0x40) != -1) && (2 < *(int *)(pcVar1 + 0x40))) {
    close(*(int *)(pcVar1 + 0x40));
  }
  __file = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (in_stack_ffffffffffffff28);
  __argv = std::vector<char_*,_std::allocator<char_*>_>::data
                     ((vector<char_*,_std::allocator<char_*>_> *)in_stack_ffffffffffffff28);
  iVar2 = execvp(__file,__argv);
  if (iVar2 == -1) {
    uVar3 = __cxa_allocate_exception(0x10);
    __a = &local_4a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RDI,__file,__a);
    __errno_location();
    OSError::OSError((OSError *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(uVar3,&OSError::typeinfo,OSError::~OSError);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    _exit(1);
  }
  __stack_chk_fail();
}

Assistant:

inline void Child::execute_child() {
#ifndef __USING_WINDOWS__
    int sys_ret = -1;
    auto& stream = parent_->stream_;

    try {
      if (stream.write_to_parent_ == 0)
        stream.write_to_parent_ = dup(stream.write_to_parent_);

      if (stream.err_write_ == 0 || stream.err_write_ == 1)
        stream.err_write_ = dup(stream.err_write_);

      // Make the child owned descriptors as the
      // stdin, stdout and stderr for the child process
      auto _dup2_ = [](int fd, int to_fd) {
        if (fd == to_fd) {
          // dup2 syscall does not reset the
          // CLOEXEC flag if the descriptors
          // provided to it are same.
          // But, we need to reset the CLOEXEC
          // flag as the provided descriptors
          // are now going to be the standard
          // input, output and error
          util::set_clo_on_exec(fd, false);
        } else if(fd != -1) {
          int res = dup2(fd, to_fd);
          if (res == -1) throw OSError("dup2 failed", errno);
        }
      };

      // Create the standard streams
      _dup2_(stream.read_from_parent_, 0); // Input stream
      _dup2_(stream.write_to_parent_,  1); // Output stream
      _dup2_(stream.err_write_,        2); // Error stream

      // Close the duped descriptors
      if (stream.read_from_parent_ != -1 && stream.read_from_parent_ > 2)
        close(stream.read_from_parent_);

      if (stream.write_to_parent_ != -1 && stream.write_to_parent_ > 2)
        close(stream.write_to_parent_);

      if (stream.err_write_ != -1 && stream.err_write_ > 2)
        close(stream.err_write_);

      // Replace the current image with the executable
      sys_ret = execvp(parent_->exe_name_.c_str(), parent_->cargv_.data());

      if (sys_ret == -1) throw OSError("execve failed", errno);

    } catch (const OSError& exp) {
      // Just write the exception message
      // TODO: Give back stack trace ?
      std::string err_msg(exp.what());
      //ATTN: Can we do something on error here ?
      util::write_n(err_wr_pipe_, err_msg.c_str(), err_msg.length());
    }

    // Calling application would not get this
    // exit failure
    _exit (EXIT_FAILURE);
#endif
  }